

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

NeuralNetwork *
addInnerProductLayer
          (Model *m,bool isUpdatable,char *name,TensorAttributes *inTensorAttr,
          TensorAttributes *outTensorAttr,bool areWeightsQuantized,bool isBiasQuantized)

{
  NeuralNetwork *this;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *pWVar1;
  QuantizationParams *pQVar2;
  LinearQuantizationParams *pLVar3;
  float fVar4;
  int iVar5;
  string local_50;
  
  if (m->_oneof_case_[0] == 500) {
    this = (NeuralNetwork *)(m->Type_).pipeline_;
  }
  else {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    this = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this);
    (m->Type_).neuralnetwork_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (&(this->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::set_name(this_00,name);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,inTensorAttr->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,outTensorAttr->name);
  if (this_00->_oneof_case_[0] == 0x8c) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01.innerproduct_);
    (this_00->layer_).innerproduct_ = (InnerProductLayerParams *)this_01;
  }
  (this_01.innerproduct_)->inputchannels_ = 1;
  (this_01.innerproduct_)->outputchannels_ = 1;
  pWVar1 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
  if (pWVar1 == (WeightParams *)0x0) {
    pWVar1 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar1);
    ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar1;
  }
  if (areWeightsQuantized) {
    pQVar2 = pWVar1->quantization_;
    if (pQVar2 == (QuantizationParams *)0x0) {
      pQVar2 = (QuantizationParams *)operator_new(0x28);
      CoreML::Specification::QuantizationParams::QuantizationParams(pQVar2);
      pWVar1->quantization_ = pQVar2;
    }
    pQVar2->numberofbits_ = 1;
    if (pQVar2->_oneof_case_[0] == 0x65) {
      pLVar3 = (pQVar2->QuantizationType_).linearquantization_;
    }
    else {
      CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar2);
      pQVar2->_oneof_case_[0] = 0x65;
      pLVar3 = (LinearQuantizationParams *)operator_new(0x40);
      CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar3);
      (pQVar2->QuantizationType_).linearquantization_ = pLVar3;
    }
    iVar5 = (pLVar3->scale_).current_size_;
    if (iVar5 == (pLVar3->scale_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar3->scale_,iVar5 + 1);
      iVar5 = (pLVar3->scale_).current_size_;
    }
    (pLVar3->scale_).current_size_ = iVar5 + 1;
    ((pLVar3->scale_).rep_)->elements[iVar5] = 1.0;
    iVar5 = (pLVar3->bias_).current_size_;
    if (iVar5 == (pLVar3->bias_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar3->bias_,iVar5 + 1);
      iVar5 = (pLVar3->bias_).current_size_;
    }
    (pLVar3->bias_).current_size_ = iVar5 + 1;
    ((pLVar3->bias_).rep_)->elements[iVar5] = 0.0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"x01","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pWVar1->int8rawvalue_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    fVar4 = (float)(pWVar1->floatvalue_).current_size_;
    if (fVar4 == (float)(pWVar1->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar1->floatvalue_,(int)fVar4 + 1);
      fVar4 = (float)(pWVar1->floatvalue_).current_size_;
    }
    (pWVar1->floatvalue_).current_size_ = (int)fVar4 + 1;
    ((pWVar1->floatvalue_).rep_)->elements[(int)fVar4] = 1.0;
  }
  (this_01.innerproduct_)->hasbias_ = true;
  pWVar1 = (this_01.innerproduct_)->bias_;
  if (pWVar1 == (WeightParams *)0x0) {
    pWVar1 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar1);
    (this_01.innerproduct_)->bias_ = pWVar1;
  }
  if (isBiasQuantized) {
    pQVar2 = pWVar1->quantization_;
    if (pQVar2 == (QuantizationParams *)0x0) {
      pQVar2 = (QuantizationParams *)operator_new(0x28);
      CoreML::Specification::QuantizationParams::QuantizationParams(pQVar2);
      pWVar1->quantization_ = pQVar2;
    }
    pQVar2->numberofbits_ = 1;
    if (pQVar2->_oneof_case_[0] == 0x65) {
      pLVar3 = (pQVar2->QuantizationType_).linearquantization_;
    }
    else {
      CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar2);
      pQVar2->_oneof_case_[0] = 0x65;
      pLVar3 = (LinearQuantizationParams *)operator_new(0x40);
      CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar3);
      (pQVar2->QuantizationType_).linearquantization_ = pLVar3;
    }
    iVar5 = (pLVar3->scale_).current_size_;
    if (iVar5 == (pLVar3->scale_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar3->scale_,iVar5 + 1);
      iVar5 = (pLVar3->scale_).current_size_;
    }
    (pLVar3->scale_).current_size_ = iVar5 + 1;
    ((pLVar3->scale_).rep_)->elements[iVar5] = 1.0;
    iVar5 = (pLVar3->bias_).current_size_;
    if (iVar5 == (pLVar3->bias_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar3->bias_,iVar5 + 1);
      iVar5 = (pLVar3->bias_).current_size_;
    }
    (pLVar3->bias_).current_size_ = iVar5 + 1;
    ((pLVar3->bias_).rep_)->elements[iVar5] = 0.0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"x01","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pWVar1->int8rawvalue_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar5 = (pWVar1->floatvalue_).current_size_;
    if (iVar5 == (pWVar1->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar1->floatvalue_,iVar5 + 1);
      iVar5 = (pWVar1->floatvalue_).current_size_;
    }
    (pWVar1->floatvalue_).current_size_ = iVar5 + 1;
    ((pWVar1->floatvalue_).rep_)->elements[iVar5] = 1.0;
  }
  if (isUpdatable) {
    this_00->isupdatable_ = true;
    pWVar1 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
    if (pWVar1 == (WeightParams *)0x0) {
      pWVar1 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar1);
      ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar1;
    }
    pWVar1->isupdatable_ = true;
    pWVar1 = (this_01.innerproduct_)->bias_;
    if (pWVar1 == (WeightParams *)0x0) {
      pWVar1 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar1);
      (this_01.innerproduct_)->bias_ = pWVar1;
    }
    pWVar1->isupdatable_ = true;
  }
  return this;
}

Assistant:

Specification::NeuralNetwork* addInnerProductLayer(Specification::Model& m, bool isUpdatable, const char *name, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, bool areWeightsQuantized, bool isBiasQuantized) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto layer = neuralNet->add_layers();
    
    layer->set_name(name);
    layer->add_input(inTensorAttr->name);
    layer->add_output(outTensorAttr->name);
    Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    // set weight
    auto* weights = innerProductParams->mutable_weights();
    if (areWeightsQuantized) {
        auto *quant_params = weights->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        weights->set_int8rawvalue("x01"); // this is [1]
    } else {
        weights->add_floatvalue(1.0);
    }

    // set bias
    innerProductParams->set_hasbias(true);
    auto* bias = innerProductParams->mutable_bias();
    if (isBiasQuantized) {
        auto *quant_params = bias->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        bias->set_int8rawvalue("x01"); // this is [1]
    } else {
        bias->add_floatvalue(1.0);
    }
    
    if (isUpdatable) {
        layer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        innerProductParams->mutable_bias()->set_isupdatable(true);
    }

    return neuralNet;
}